

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O2

UINT8 __thiscall DROPlayer::Start(DROPlayer *this)

{
  UINT8 *pUVar1;
  RESMPL_STATE *CAA;
  pointer puVar2;
  DEVFUNC_OPTMASK p_Var3;
  PLAYER_EVENT_CB p_Var4;
  UINT8 UVar5;
  byte bVar6;
  long lVar7;
  PLR_DEV_OPTS *pPVar8;
  pointer p_Var9;
  ulong uVar10;
  PLR_DEV_OPTS *pPVar11;
  DEV_GEN_CFG local_50;
  PLR_DEV_OPTS *local_40;
  size_t local_38;
  
  for (lVar7 = 0x38; lVar7 != 0x3b; lVar7 = lVar7 + 1) {
    pUVar1 = (this->_fileHdr).regCmdMap + lVar7 * 8 + -0x42;
    pUVar1[0] = 0xff;
    pUVar1[1] = 0xff;
    pUVar1[2] = 0xff;
    pUVar1[3] = 0xff;
    pUVar1[4] = 0xff;
    pUVar1[5] = 0xff;
    pUVar1[6] = 0xff;
    pUVar1[7] = 0xff;
  }
  p_Var9 = (this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>.
      _M_impl.super__Vector_impl_data._M_finish != p_Var9) {
    (this->_devices).super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>._M_impl
    .super__Vector_impl_data._M_finish = p_Var9;
  }
  std::vector<_dro_chip_device,_std::allocator<_dro_chip_device>_>::resize
            (&this->_devices,
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->_devTypes).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  local_40 = this->_devOpts;
  uVar10 = 0;
  do {
    puVar2 = (this->_devTypes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_devTypes).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) <= uVar10) {
      this->_playState = this->_playState | 1;
      (*(this->super_PlayerBase)._vptr_PlayerBase[0x1d])(this);
      p_Var4 = (this->super_PlayerBase)._eventCbFunc;
      if (p_Var4 != (PLAYER_EVENT_CB)0x0) {
        (*p_Var4)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x01',(void *)0x0)
        ;
      }
      return '\0';
    }
    p_Var9 = (this->_devices).
             super__Vector_base<_dro_chip_device,_std::allocator<_dro_chip_device>_>._M_impl.
             super__Vector_impl_data._M_start;
    p_Var9[uVar10].base.defInf.dataPtr = (DEV_DATA *)0x0;
    p_Var9[uVar10].base.linkDev = (VGM_BASEDEV *)0x0;
    UVar5 = puVar2[uVar10];
    local_38 = DeviceID2OptionID(this,(UINT32)uVar10);
    p_Var9[uVar10].optID = local_38;
    pPVar8 = local_40 + local_38;
    pPVar11 = (PLR_DEV_OPTS *)0x0;
    if (local_38 == 0xffffffffffffffff) {
      local_50.emuCore = 0;
      local_50.srMode = '\0';
      local_50.flags = '\0';
      local_50.clock = 0x369e99;
      if (UVar5 == '\f') {
        local_50.clock = 0xda7a64;
      }
LAB_0011d84f:
      local_50.smplRate = (this->super_PlayerBase)._outSmplRate;
    }
    else {
      local_50.emuCore = pPVar8->emuCore;
      local_50.clock = 0x369e99;
      if (UVar5 == '\f') {
        local_50.clock = 0xda7a64;
      }
      local_50.flags = '\0';
      local_50.srMode = pPVar8->srMode;
      local_50.smplRate = pPVar8->smplRate;
      pPVar11 = pPVar8;
      if (local_50.smplRate == 0) goto LAB_0011d84f;
    }
    p_Var9 = p_Var9 + uVar10;
    UVar5 = SndEmu_Start(UVar5,&local_50,(DEV_INFO *)p_Var9);
    if (UVar5 == '\0') {
      SndEmu_GetDeviceFunc((p_Var9->base).defInf.devDef,'\0','\x11',0,&p_Var9->write);
      SetupLinkedDevices(&p_Var9->base,(SETUPLINKDEV_CB)0x0,(void *)0x0);
      if (local_38 != 0xffffffffffffffff) {
        p_Var3 = ((p_Var9->base).defInf.devDef)->SetOptionBits;
        if (p_Var3 != (DEVFUNC_OPTMASK)0x0) {
          (*p_Var3)((p_Var9->base).defInf.dataPtr,pPVar8->coreOpts);
        }
        this->_optDevMap[p_Var9->optID] = uVar10;
      }
      for (; p_Var9 != (pointer)0x0; p_Var9 = (pointer)(p_Var9->base).linkDev) {
        p_Var3 = ((p_Var9->base).defInf.devDef)->SetMuteMask;
        if (p_Var3 != (DEVFUNC_OPTMASK)0x0) {
          (*p_Var3)((p_Var9->base).defInf.dataPtr,(pPVar11->muteOpts).chnMute[0]);
        }
        CAA = &(p_Var9->base).resmpl;
        Resmpl_SetVals(CAA,0xff,0x100,(this->super_PlayerBase)._outSmplRate);
        puVar2 = (this->_devPanning).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        bVar6 = puVar2[uVar10];
        if ((bVar6 & 2) != 0) {
          (p_Var9->base).resmpl.volumeL = 0;
          bVar6 = puVar2[uVar10];
        }
        if ((bVar6 & 1) != 0) {
          (p_Var9->base).resmpl.volumeR = 0;
        }
        Resmpl_DevConnect(CAA,(DEV_INFO *)p_Var9);
        Resmpl_Init(CAA);
      }
    }
    else {
      (p_Var9->base).defInf.dataPtr = (DEV_DATA *)0x0;
      (p_Var9->base).defInf.devDef = (DEV_DEF *)0x0;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

UINT8 DROPlayer::Start(void)
{
	size_t curDev;
	UINT8 retVal;
	
	for (curDev = 0; curDev < 3; curDev ++)
		_optDevMap[curDev] = (size_t)-1;
	
	_devices.clear();
	_devices.resize(_devTypes.size());
	for (curDev = 0; curDev < _devTypes.size(); curDev ++)
	{
		DRO_CHIPDEV* cDev = &_devices[curDev];
		PLR_DEV_OPTS* devOpts;
		DEV_GEN_CFG devCfg;
		VGM_BASEDEV* clDev;
		UINT8 deviceID;
		
		cDev->base.defInf.dataPtr = NULL;
		cDev->base.linkDev = NULL;
		deviceID = _devTypes[curDev];
		cDev->optID = DeviceID2OptionID(curDev);
		
		devOpts = (cDev->optID != (size_t)-1) ? &_devOpts[cDev->optID] : NULL;
		devCfg.emuCore = (devOpts != NULL) ? devOpts->emuCore : 0x00;
		devCfg.srMode = (devOpts != NULL) ? devOpts->srMode : DEVRI_SRMODE_NATIVE;
		devCfg.flags = 0x00;
		devCfg.clock = 3579545;
		if (deviceID == DEVID_YMF262)
			devCfg.clock *= 4;	// OPL3 uses a 14 MHz clock
		if (devOpts != NULL && devOpts->smplRate)
			devCfg.smplRate = devOpts->smplRate;
		else
			devCfg.smplRate = _outSmplRate;
		
		retVal = SndEmu_Start(deviceID, &devCfg, &cDev->base.defInf);
		if (retVal)
		{
			cDev->base.defInf.dataPtr = NULL;
			cDev->base.defInf.devDef = NULL;
			continue;
		}
		SndEmu_GetDeviceFunc(cDev->base.defInf.devDef, RWF_REGISTER | RWF_WRITE, DEVRW_A8D8, 0, (void**)&cDev->write);
		
		SetupLinkedDevices(&cDev->base, NULL, NULL);
		
		if (devOpts != NULL)
		{
			if (cDev->base.defInf.devDef->SetOptionBits != NULL)
				cDev->base.defInf.devDef->SetOptionBits(cDev->base.defInf.dataPtr, devOpts->coreOpts);
			
			_optDevMap[cDev->optID] = curDev;
		}
		
		for (clDev = &cDev->base; clDev != NULL; clDev = clDev->linkDev)
		{
			if (clDev->defInf.devDef->SetMuteMask != NULL)
				clDev->defInf.devDef->SetMuteMask(clDev->defInf.dataPtr, devOpts->muteOpts.chnMute[0]);
			
			Resmpl_SetVals(&clDev->resmpl, 0xFF, 0x100, _outSmplRate);
			// do DualOPL2 hard panning by muting either the left or right speaker
			if (_devPanning[curDev] & 0x02)
				clDev->resmpl.volumeL = 0x00;
			if (_devPanning[curDev] & 0x01)
				clDev->resmpl.volumeR = 0x00;
			Resmpl_DevConnect(&clDev->resmpl, &clDev->defInf);
			Resmpl_Init(&clDev->resmpl);
		}
	}
	
	_playState |= PLAYSTATE_PLAY;
	Reset();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_START, NULL);
	
	return 0x00;
}